

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O3

void __thiscall DIS::SeesPdu::~SeesPdu(SeesPdu *this)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pPVar6;
  
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__SeesPdu_001a0ff0;
  pPVar1 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar6 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      (**pPVar6->_vptr_PropulsionSystemData)(pPVar6);
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != pPVar2);
    (this->_propulsionSystemData).
    super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pVVar3 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar5 = pVVar3;
  if (pVVar4 != pVVar3) {
    do {
      (**pVVar5->_vptr_VectoringNozzleSystemData)(pVVar5);
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar4);
    (this->_vectoringSystemData).
    super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  std::vector<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>::
  ~vector(&this->_vectoringSystemData);
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::~vector
            (&this->_propulsionSystemData);
  EntityID::~EntityID(&this->_orginatingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

SeesPdu::~SeesPdu()
{
    _propulsionSystemData.clear();
    _vectoringSystemData.clear();
}